

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QDockWidget * __thiscall QDockAreaLayoutInfo::apply(QDockAreaLayoutInfo *this,bool animate)

{
  uint uVar1;
  uint uVar2;
  QDockAreaLayoutInfo *this_00;
  bool bVar3;
  bool bVar4;
  Representation RVar5;
  int iVar6;
  QMainWindowLayout *pQVar7;
  QSize QVar8;
  pointer pQVar9;
  undefined4 extraout_var;
  QWidget *pQVar10;
  QWidget *pQVar11;
  QDockAreaLayoutItem *this_01;
  int i;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  QWidget *local_60;
  undefined1 local_48 [12];
  Representation RStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = mainWindowLayout(this);
  if (this->tabbed != true) goto LAB_003cabfa;
  _local_48 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  QVar8 = tabBarSizeHint(this);
  RVar5 = QVar8.wd.m_i;
  if ((ulong)QVar8 >> 0x20 != 0 || RVar5.m_i != 0) {
    switch(this->tabBarShape) {
    case 0:
    case 4:
      local_48._0_4_ = (this->rect).x1.m_i;
      local_48._4_4_ = (this->rect).y1.m_i;
      local_48._8_4_ = (this->rect).x2.m_i;
      RStack_3c.m_i = QVar8.ht.m_i.m_i + local_48._4_4_ + -1;
      break;
    case 1:
    case 5:
      RStack_3c.m_i = (this->rect).y2.m_i;
      local_48._4_4_ = (RStack_3c.m_i - QVar8.ht.m_i) + 1;
      local_48._0_4_ = (this->rect).x1.m_i;
      local_48._8_4_ = (this->rect).x2.m_i;
      break;
    case 2:
    case 6:
      local_48._0_4_ = (this->rect).x1.m_i;
      local_48._4_4_ = (this->rect).y1.m_i;
      RStack_3c.m_i = (this->rect).y2.m_i;
      local_48._8_4_ = RVar5.m_i + local_48._0_4_ + -1;
      break;
    case 3:
    case 7:
      local_48._4_4_ = (this->rect).y1.m_i;
      local_48._8_4_ = (this->rect).x2.m_i;
      local_48._0_4_ = (local_48._8_4_ - RVar5.m_i) + 1;
      RStack_3c.m_i = (this->rect).y2.m_i;
      break;
    default:
      goto switchD_003cab8a_default;
    }
  }
switchD_003cab8a_default:
  QWidgetAnimator::animate
            ((QWidgetAnimator *)&pQVar7->widgetAnimator,&this->tabBar->super_QWidget,
             (QRect *)local_48,animate);
LAB_003cabfa:
  lVar13 = 0;
  uVar12 = 0;
  local_60 = (QWidget *)0x0;
  do {
    if ((ulong)(this->item_list).d.size <= uVar12) {
      if (*this->sep == 1) {
        updateSeparatorWidgets(this);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (QDockWidget *)local_60;
    }
    pQVar9 = QList<QDockAreaLayoutItem>::data(&this->item_list);
    if ((*(byte *)((long)&pQVar9->flags + lVar13) & 1) == 0) {
      this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar9->subinfo + lVar13);
      if (this_00 == (QDockAreaLayoutInfo *)0x0) {
        this_01 = (QDockAreaLayoutItem *)((long)&pQVar9->widgetItem + lVar13);
        bVar4 = QDockAreaLayoutItem::skip(this_01);
        if (!bVar4) {
          stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
          local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          _local_48 = itemRect(this,(int)uVar12,false);
          iVar6 = (*this_01->widgetItem->_vptr_QLayoutItem[0xd])();
          pQVar11 = (QWidget *)CONCAT44(extraout_var,iVar6);
          uVar1 = (pQVar11->data->crect).x2.m_i;
          uVar2 = (pQVar11->data->crect).y2.m_i;
          QWidgetAnimator::animate
                    ((QWidgetAnimator *)&pQVar7->widgetAnimator,pQVar11,(QRect *)local_48,animate);
          if (((pQVar11->data->widget_attributes & 0x10000) == 0) &&
             (pQVar10 = QWidget::window(pQVar11), (pQVar10->data->widget_attributes & 0x8000) != 0))
          {
            pQVar11 = &QtPrivate::qobject_cast_helper<QDockWidget*,QObject>((QObject *)pQVar11)->
                       super_QWidget;
            bVar4 = (int)local_48._0_4_ <= (int)local_48._8_4_;
            bVar3 = (int)local_48._4_4_ <= RStack_3c.m_i;
            if (bVar3 && (int)local_48._0_4_ <= (int)local_48._8_4_) {
              pQVar10 = pQVar11;
              if ((int)(uVar1 | uVar2) < 0) {
LAB_003cad12:
                QDockWidget::visibilityChanged((QDockWidget *)pQVar11,bVar3 && bVar4);
                local_60 = pQVar10;
              }
            }
            else if (-1 < (int)(uVar1 | uVar2)) {
              QWidget::lower(pQVar11);
              pQVar10 = local_60;
              goto LAB_003cad12;
            }
          }
        }
      }
      else {
        apply(this_00,animate);
      }
    }
    uVar12 = uVar12 + 1;
    lVar13 = lVar13 + 0x28;
  } while( true );
}

Assistant:

QDockWidget *QDockAreaLayoutInfo::apply(bool animate)
{
    QWidgetAnimator &widgetAnimator = mainWindowLayout()->widgetAnimator;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        QRect tab_rect;
        QSize tbh = tabBarSizeHint();

        if (!tbh.isNull()) {
            switch (tabBarShape) {
                case QTabBar::RoundedNorth:
                case QTabBar::TriangularNorth:
                    tab_rect = QRect(rect.left(), rect.top(), rect.width(), tbh.height());
                    break;
                case QTabBar::RoundedSouth:
                case QTabBar::TriangularSouth:
                    tab_rect = QRect(rect.left(), rect.bottom() - tbh.height() + 1,
                                        rect.width(), tbh.height());
                    break;
                case QTabBar::RoundedEast:
                case QTabBar::TriangularEast:
                    tab_rect = QRect(rect.right() - tbh.width() + 1, rect.top(),
                                        tbh.width(), rect.height());
                    break;
                case QTabBar::RoundedWest:
                case QTabBar::TriangularWest:
                    tab_rect = QRect(rect.left(), rect.top(),
                                        tbh.width(), rect.height());
                    break;
                default:
                    break;
            }
        }

        widgetAnimator.animate(tabBar, tab_rect, animate);
    }
#endif // QT_CONFIG(tabbar)

    QDockWidget *activated = nullptr;

    for (int i = 0; i < item_list.size(); ++i) {
        QDockAreaLayoutItem &item = item_list[i];

        if (item.flags & QDockAreaLayoutItem::GapItem)
            continue;

        if (item.subinfo != nullptr) {
            item.subinfo->apply(animate);
            continue;
        }

        if (item.skip())
            continue;

        Q_ASSERT(item.widgetItem);
        QRect r = itemRect(i);
        QWidget *w = item.widgetItem->widget();

        QRect geo = w->geometry();
        widgetAnimator.animate(w, r, animate);
        if (!w->isHidden() && w->window()->isVisible()) {
            QDockWidget *dw = qobject_cast<QDockWidget*>(w);
            if (!r.isValid() && geo.right() >= 0 && geo.bottom() >= 0) {
                dw->lower();
                emit dw->visibilityChanged(false);
            } else if (r.isValid()
                        && (geo.right() < 0 || geo.bottom() < 0)) {
                emit dw->visibilityChanged(true);
                activated = dw;
            }
        }
    }
#if QT_CONFIG(tabbar)
    if (*sep == 1)
        updateSeparatorWidgets();
#endif // QT_CONFIG(tabbar)

    return activated;
}